

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O1

BOOL __thiscall
Js::ModuleNamespace::DeleteProperty
          (ModuleNamespace *this,JavascriptString *propertyNameString,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  local_28 = (PropertyRecord *)0x0;
  bVar2 = JavascriptOperators::ShouldTryDeleteProperty
                    ((RecyclableObject *)this,propertyNameString,&local_28);
  iVar3 = 1;
  if (bVar2) {
    if (local_28 == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ModuleNamespace.cpp"
                                  ,0x150,"(propertyRecord)","propertyRecord");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    iVar3 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])
                      (this,(ulong)(uint)local_28->pid,(ulong)flags);
  }
  return iVar3;
}

Assistant:

BOOL ModuleNamespace::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        //Assert: IsPropertyKey(P) is true.
        //Let exports be O.[[Exports]].
        //If P is an element of exports, return false.
        //Return true.
        PropertyRecord const *propertyRecord = nullptr;
        if (JavascriptOperators::ShouldTryDeleteProperty(this, propertyNameString, &propertyRecord))
        {
            Assert(propertyRecord);
            return DeleteProperty(propertyRecord->GetPropertyId(), flags);
        }

        return TRUE;
    }